

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

_Bool prefs_save(char *path,_func_void_ang_file_ptr *dump,char *title)

{
  _Bool _Var1;
  int iVar2;
  ang_file *paVar3;
  ang_file *f;
  byte bVar4;
  bool bVar5;
  bool bVar6;
  char new_fname [1024];
  char old_fname [1024];
  char end_line [1024];
  char start_line [1024];
  char buf [1024];
  char local_1438 [1024];
  char local_1038 [1024];
  char local_c38 [1024];
  char local_838 [1024];
  char local_438 [1032];
  
  file_get_tempfile(local_1438,0x400,path,"new");
  strnfmt(local_838,0x400,"%s begin %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  strnfmt(local_c38,0x400,"%s end %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  paVar3 = file_open(path,MODE_READ,FTYPE_TEXT);
  if (paVar3 != (ang_file *)0x0) {
    f = file_open(local_1438,MODE_WRITE,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      file_close(paVar3);
      msg("Failed to create file %s",local_1438);
    }
    else {
      _Var1 = file_getl(paVar3,local_438,0x400);
      if (_Var1) {
        bVar4 = 0;
        bVar5 = false;
        do {
          iVar2 = strcmp(local_438,local_838);
          if (iVar2 == 0) {
            bVar4 = 1;
          }
          else {
            iVar2 = strcmp(local_438,local_c38);
            bVar6 = iVar2 == 0;
            if ((bool)(bVar6 | bVar4)) {
              bVar4 = bVar4 & !bVar6;
              bVar5 = (bool)(bVar5 | bVar6);
            }
            else {
              bVar4 = 0;
              file_putf(f,"%s\n",local_438);
            }
          }
          _Var1 = file_getl(paVar3,local_438,0x400);
        } while (_Var1);
        file_close(paVar3);
        file_close(f);
        if (bVar5) {
          file_get_tempfile(local_1038,0x400,path,"old");
          _Var1 = file_move(path,local_1038);
          if (_Var1) {
            file_move(local_1438,path);
            file_delete(local_1038);
          }
          goto LAB_00201f4c;
        }
      }
      else {
        file_close(paVar3);
        file_close(f);
      }
      file_delete(local_1438);
    }
  }
LAB_00201f4c:
  paVar3 = file_open(path,MODE_APPEND,FTYPE_TEXT);
  if (paVar3 != (ang_file *)0x0) {
    file_putf(paVar3,"%s begin %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_putf(paVar3,"# *Warning!*  The lines below are an automatic dump.\n");
    file_putf(paVar3,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar3,"\n");
    (*dump)(paVar3);
    file_putf(paVar3,"\n");
    file_putf(paVar3,"# *Warning!*  The lines above are an automatic dump.\n");
    file_putf(paVar3,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar3,"%s end %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_close(paVar3);
  }
  return paVar3 != (ang_file *)0x0;
}

Assistant:

bool prefs_save(const char *path, void (*dump)(ang_file *), const char *title)
{
	ang_file *fff;

	/* Remove old keymaps */
	remove_old_dump(path, title);

	fff = file_open(path, MODE_APPEND, FTYPE_TEXT);
	if (!fff) {
		return false;
	}

	/* Append the header */
	pref_header(fff, title);
	file_putf(fff, "\n");

	dump(fff);

	file_putf(fff, "\n");
	pref_footer(fff, title);
	file_close(fff);

	return true;
}